

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckVariablePerLine.cxx
# Opt level: O3

bool __thiscall kws::Parser::CheckVariablePerLine(Parser *this,unsigned_long max)

{
  size_t pos;
  string *psVar1;
  string *psVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  char *__s;
  size_t pos_00;
  long lVar7;
  long *plVar8;
  size_t sVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  size_t sVar11;
  long *plVar12;
  char cVar13;
  long lVar14;
  bool bVar15;
  string line;
  string line_temp;
  char localval [22];
  string typeToFind;
  uint local_23c;
  string local_230;
  value_type local_210;
  undefined6 *local_1d8;
  undefined6 uStack_1d0;
  undefined2 uStack_1ca;
  undefined6 uStack_1c8;
  undefined2 uStack_1c2;
  long lStack_1c0;
  undefined8 local_1b0;
  unsigned_long local_1a8;
  string local_1a0;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  long local_160;
  Parser *local_158;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  this->m_TestsDone[0x1a] = true;
  __s = (char *)operator_new__(0xff);
  local_1a8 = max;
  snprintf(__s,0xff,"Variables per line = %ld max",max);
  pcVar3 = (char *)this->m_TestsDescription[0x1a]._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0x1a),0,pcVar3,(ulong)__s);
  operator_delete__(__s);
  psVar1 = &this->m_BufferNoComment;
  local_1b0 = 0;
  local_160 = 0;
  local_158 = this;
  do {
    std::__cxx11::string::string
              ((string *)local_180,*(char **)((long)&DAT_00195d30 + local_160),
               (allocator *)&local_210);
    std::__cxx11::string::append((char *)local_180);
    for (pos_00 = std::__cxx11::string::find((char *)psVar1,(ulong)local_180[0],0);
        pos_00 != 0xffffffffffffffff;
        pos_00 = std::__cxx11::string::find((char *)psVar1,(ulong)local_180[0],pos_00 + 1)) {
      sVar11 = pos_00;
      do {
        if ((long)sVar11 < 2) goto LAB_00155fbc;
        cVar13 = (psVar1->_M_dataplus)._M_p[sVar11 - 1];
        sVar11 = sVar11 - 1;
      } while (cVar13 == ' ');
      if (cVar13 == '\n') {
LAB_00155fbc:
        lVar7 = GetLineNumber(this,pos_00,true);
        GetLine_abi_cxx11_(&local_230,this,lVar7 - 1);
        iVar5 = std::__cxx11::string::find((char *)&local_230,0x16952a,0);
        if (iVar5 != -1) {
          std::__cxx11::string::substr((ulong)&local_210,(ulong)&local_230);
          std::__cxx11::string::operator=((string *)&local_230,(string *)&local_210);
          this = local_158;
          if ((unsigned_long *)local_210.line != &local_210.number) {
            operator_delete((void *)local_210.line);
            this = local_158;
          }
        }
        uVar6 = std::__cxx11::string::find((char *)&local_230,0x16952d,0);
        while (uVar6 != 0xffffffff) {
          iVar5 = std::__cxx11::string::find((char *)&local_230,0x169530,0);
          if (iVar5 == -1) {
            std::__cxx11::string::substr((ulong)&local_210,(ulong)&local_230);
            std::__cxx11::string::operator=((string *)&local_230,(string *)&local_210);
            if ((unsigned_long *)local_210.line != &local_210.number) {
              operator_delete((void *)local_210.line);
            }
            break;
          }
          std::__cxx11::string::substr((ulong)&local_210,(ulong)&local_230);
          std::__cxx11::string::substr((ulong)local_50,(ulong)&local_230);
          plVar8 = (long *)std::__cxx11::string::replace
                                     ((ulong)local_50,0,(char *)0x0,local_210.line);
          plVar12 = plVar8 + 2;
          if ((long *)*plVar8 == plVar12) {
            lStack_1c0 = plVar8[3];
            uStack_1c8 = (undefined6)*plVar12;
            uStack_1c2 = (undefined2)((ulong)*plVar12 >> 0x30);
            local_1d8 = &uStack_1c8;
          }
          else {
            uStack_1c8 = (undefined6)*plVar12;
            uStack_1c2 = (undefined2)((ulong)*plVar12 >> 0x30);
            local_1d8 = (undefined6 *)*plVar8;
          }
          uStack_1d0 = (undefined6)plVar8[1];
          uStack_1ca = (undefined2)((ulong)plVar8[1] >> 0x30);
          *plVar8 = (long)plVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::operator=((string *)&local_230,(string *)&local_1d8);
          if (local_1d8 != &uStack_1c8) {
            operator_delete(local_1d8);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          uVar6 = std::__cxx11::string::find
                            ((char *)&local_230,0x16952d,
                             (long)(((ulong)uVar6 << 0x20) + 0x100000000) >> 0x20);
          if ((unsigned_long *)local_210.line != &local_210.number) {
            operator_delete((void *)local_210.line);
          }
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        bVar4 = IsBetweenChars(this,'(',')',pos_00,false,&local_70);
        if (bVar4) {
          bVar4 = false;
        }
        else {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
          bVar4 = IsBetweenCharsFast(this,'(',')',pos_00,false,&local_90);
          if (bVar4) {
            bVar4 = false;
          }
          else {
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
            bVar4 = IsBetweenChars(this,'<','>',pos_00,false,&local_b0);
            if (bVar4) {
              bVar4 = false;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
              bVar4 = IsBetweenCharsFast(this,'<','>',pos_00,false,&local_d0);
              bVar4 = !bVar4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        if (bVar4) {
          sVar11 = std::__cxx11::string::find((char)&local_230,0x2c);
          if (sVar11 == 0xffffffffffffffff) {
            local_23c = 1;
          }
          else {
            local_23c = 1;
            do {
              pos_00 = std::__cxx11::string::find((char)psVar1,0x2c);
              local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"");
              bVar4 = IsBetweenChars(this,'(',')',pos_00,false,&local_1a0);
              if (bVar4) {
                bVar4 = false;
              }
              else {
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
                bVar4 = IsBetweenCharsFast(this,'(',')',pos_00,false,&local_f0);
                if (bVar4) {
                  bVar4 = false;
                }
                else {
                  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
                  bVar4 = IsBetweenChars(this,'<','>',pos_00,false,&local_110);
                  if (bVar4) {
                    bVar4 = false;
                  }
                  else {
                    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
                    bVar4 = IsBetweenCharsFast(this,'<','>',pos_00,false,&local_130);
                    bVar4 = !bVar4;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
                operator_delete(local_1a0._M_dataplus._M_p);
              }
              sVar9 = sVar11;
              if (bVar4) {
                do {
                  uVar6 = 0;
                  if ((long)sVar9 < 2) {
                    bVar4 = false;
                    goto LAB_0015661c;
                  }
                  pos = sVar9 - 1;
                  lVar7 = sVar9 - 1;
                  sVar9 = pos;
                } while (local_230._M_dataplus._M_p[lVar7] != '{');
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,local_230._M_dataplus._M_p,
                           local_230._M_dataplus._M_p +
                           CONCAT44(local_230._M_string_length._4_4_,(int)local_230._M_string_length
                                   ));
                sVar9 = FindClosingChar(this,'{','}',pos,false,&local_150);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p);
                }
                bVar4 = (long)sVar11 < (long)sVar9 || sVar9 == 0xffffffffffffffff;
LAB_0015661c:
                lVar7 = (long)(int)local_230._M_string_length;
                if ((long)(sVar11 + 1) < lVar7) {
                  uVar6 = 1;
                  lVar14 = sVar11 + 2;
                  do {
                    if ((0x20 < (ulong)(byte)local_230._M_dataplus._M_p[lVar14 + -1]) ||
                       ((0x100002600U >>
                         ((ulong)(byte)local_230._M_dataplus._M_p[lVar14 + -1] & 0x3f) & 1) == 0))
                    break;
                    uVar6 = (uint)(lVar14 < lVar7);
                    bVar15 = lVar14 != lVar7;
                    lVar14 = lVar14 + 1;
                  } while (bVar15);
                }
                if (!bVar4) {
                  local_23c = local_23c + uVar6;
                }
                cVar13 = (char)&local_230;
              }
              else {
                cVar13 = (char)&local_230;
              }
              sVar11 = std::__cxx11::string::find(cVar13,0x2c);
            } while (sVar11 != 0xffffffffffffffff);
          }
          if (local_1a8 < local_23c) {
            local_1d8 = (undefined6 *)0x0;
            uStack_1d0 = 0;
            uStack_1ca = 0;
            uStack_1c8 = 0;
            local_210.description._M_dataplus._M_p = (pointer)&local_210.description.field_2;
            local_210.description._M_string_length = 0;
            local_210.description.field_2._M_local_buf[0] = '\0';
            local_210.line = GetLineNumber(this,pos_00,true);
            psVar2 = &local_210.description;
            local_210.number = 0x1a;
            local_210.line2 = local_210.line;
            std::__cxx11::string::_M_replace
                      ((ulong)psVar2,0,(char *)local_210.description._M_string_length,0x176c91);
            snprintf((char *)&local_1d8,0x16,"%d",(ulong)local_23c);
            std::__cxx11::string::append((char *)psVar2);
            std::__cxx11::string::append((char *)psVar2);
            local_1d8 = (undefined6 *)((ulong)local_1d8 & 0xffffffffffffff00);
            snprintf((char *)&local_1d8,0x16,"%ld",local_1a8);
            std::__cxx11::string::append((char *)psVar2);
            std::__cxx11::string::append((char *)psVar2);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,&local_210);
            paVar10 = &local_210.description.field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210.description._M_dataplus._M_p != paVar10) {
              operator_delete(local_210.description._M_dataplus._M_p);
              paVar10 = extraout_RAX;
            }
            local_1b0 = CONCAT71((int7)((ulong)paVar10 >> 8),1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
      }
    }
    if (local_180[0] != local_170) {
      operator_delete(local_180[0]);
    }
    local_160 = local_160 + 8;
    if (local_160 == 0x60) {
      return (bool)(~(byte)local_1b0 & 1);
    }
  } while( true );
}

Assistant:

bool Parser::CheckVariablePerLine(unsigned long max)
{
  m_TestsDone[VARIABLEPERLINE] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"Variables per line = %ld max",max);
  m_TestsDescription[VARIABLEPERLINE] = val;
  delete [] val;

  // For the moment only standard types are defined.
  // We might be able to do more with finding typedefs
  #define ntypes 12
  const char* types[ntypes] = {"int","unsigned int",
   "char","unsigned char",
   "short","unsigned short",
   "long","unsigned long",
   "float","double","void","long int"};

  bool hasError = false;
  for (auto &type : types) {
    std::string typeToFind = type;
    typeToFind += " ";
    size_t posType = m_BufferNoComment.find(typeToFind,0);
    while(posType != std::string::npos)
      {
      // Check that this is the first word
      bool firstWord = false;
      auto pos = static_cast<long int>(posType);
      pos--;
      while((pos>0) && (m_BufferNoComment[pos]==' '))
        {
        pos--;
        }
      if((pos<=0) || (m_BufferNoComment[pos]=='\n'))
        {
        firstWord = true;
        }

      if(firstWord)
        {
        std::string line = this->GetLine(this->GetLineNumber(posType,true)-1);

        // Check if we have any comments
        int poscom = static_cast<int>(line.find("//",0));
        if(poscom != -1)
          {
          line = line.substr(0,poscom);
          }
        poscom = static_cast<int>(line.find("/*",0));
        while(poscom != -1)
          {
          int poscomend = static_cast<int>(line.find("*/",0));
          if(poscomend == -1)
            {
            line = line.substr(0,poscom);
            break;
            }

          std::string line_temp = line.substr(0,poscom);
          line = line_temp+line.substr(poscomend+2,line.size()-poscomend-2);
          poscom = static_cast<int>(line.find("/*",poscom+1));
          }

        // If we have any '(' in the line we stop
        if( !this->IsBetweenChars( '(', ')', posType, false ) &&
          !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
          !this->IsBetweenChars( '<', '>', posType, false ) &&
          !this->IsBetweenCharsFast( '<', '>', posType, false ))
          {
          // This is a very simple check we count the number of comas
          unsigned int vars = 1;
          pos = static_cast<long int>(line.find(',',0));
          while(pos!=-1)
            {
            posType = m_BufferNoComment.find(',', posType+1);
            if( !this->IsBetweenChars( '(', ')', posType, false ) &&
              !this->IsBetweenCharsFast( '(', ')', posType, false ) &&
              !this->IsBetweenChars( '<', '>', posType, false ) &&
              !this->IsBetweenCharsFast( '<', '>', posType, false ))
              {
              // Check that we are not initializing an array
              bool betweenBraces = false;
              long int openCurly = pos-1;
              while(openCurly>0)
                {
                // Ok we have the opening
                if(line[openCurly] == '{')
                  {
                  long int posClosing = static_cast<long int>(this->FindClosingChar('{','}',openCurly,false,line));
                  if(posClosing == -1
                    || pos<posClosing)
                    {
                    betweenBraces = true;
                    }
                  break;
                  }
                openCurly--;
                }
              // Check if we are not at the end of the line
              bool endofline = true;
              long eof = pos+1;
              while(eof < (int)line.size())
                {
                if(line[eof] != ' ' && line[eof] != '\n'
                   && line[eof] != '\r' && line[eof] != '\t')
                  {
                  endofline = false;
                  break;
                  }
                eof++;
                }

              if(!betweenBraces && !endofline)
                {
                vars++;
                }
              }
            pos = static_cast<long int>(line.find(',',pos+1));
            }

          if(vars > max)
            {
            // len(str(2**64)) == 20 + 1 for +/- + 1  for '\0'
            char localval[22]={0}; //Make an extra large buffer to avoid compiler overflow warnings
            Error error;
            error.line = this->GetLineNumber(posType,true);
            error.line2 = error.line;
            error.number = VARIABLEPERLINE;
            error.description = "Number of variable per line exceed: ";
            snprintf(localval,sizeof(localval),"%d",vars);
            error.description += localval;
            error.description += " (max=";
            localval[0]='\0';
            snprintf(localval,sizeof(localval),"%ld",max);
            error.description += localval;
            error.description += ")";
            m_ErrorList.push_back(error);
            hasError = true;
            }
          }
        }// end firstWord
      posType = m_BufferNoComment.find(typeToFind,posType+1);
      }
  }

  return !hasError;
}